

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O0

void __thiscall
SigHashTest::RandomTransaction(SigHashTest *this,CMutableTransaction *tx,bool fSingle)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  vector<CTxIn,_std::allocator<CTxIn>_> *this_00;
  reference pvVar7;
  reference pvVar8;
  CAmount CVar9;
  byte in_DL;
  long in_RSI;
  RandomMixin<FastRandomContext> *in_RDI;
  long in_FS_OFFSET;
  CTxOut *txout;
  int out;
  CTxIn *txin;
  int in;
  int outs;
  int ins;
  FastRandomContext *in_stack_ffffffffffffff58;
  uint32_t local_9c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_68;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = RandomMixin<FastRandomContext>::rand32
                    (&in_stack_ffffffffffffff58->super_RandomMixin<FastRandomContext>);
  *(uint32_t *)(in_RSI + 0x30) = uVar3;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff58);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::clear
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff58);
  bVar2 = RandomMixin<FastRandomContext>::randbool
                    (&in_stack_ffffffffffffff58->super_RandomMixin<FastRandomContext>);
  if (bVar2) {
    uVar3 = RandomMixin<FastRandomContext>::rand32
                      (&in_stack_ffffffffffffff58->super_RandomMixin<FastRandomContext>);
  }
  else {
    uVar3 = 0;
  }
  *(uint32_t *)(in_RSI + 0x34) = uVar3;
  uVar6 = RandomMixin<FastRandomContext>::randbits(in_RDI,uVar3);
  iVar4 = (int)uVar6 + 1;
  if ((in_DL & 1) == 0) {
    uVar6 = RandomMixin<FastRandomContext>::randbits(in_RDI,uVar3);
    this_00 = (vector<CTxIn,_std::allocator<CTxIn>_> *)(uVar6 + 1);
  }
  else {
    this_00 = (vector<CTxIn,_std::allocator<CTxIn>_> *)(long)iVar4;
  }
  iVar5 = (int)this_00;
  for (local_68 = 0; local_68 < iVar4; local_68 = local_68 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<>(this_00);
    pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::back
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff58);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffff58);
    *(undefined8 *)(pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_28
    ;
    *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         local_20;
    *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_18;
    *(undefined8 *)((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_10;
    uVar6 = RandomMixin<FastRandomContext>::randbits(in_RDI,uVar3);
    (pvVar7->prevout).n = (uint32_t)uVar6;
    RandomScript((SigHashTest *)in_RDI,(CScript *)CONCAT44(uVar3,in_stack_ffffffffffffff70));
    bVar2 = RandomMixin<FastRandomContext>::randbool
                      (&in_stack_ffffffffffffff58->super_RandomMixin<FastRandomContext>);
    if (bVar2) {
      local_9c = RandomMixin<FastRandomContext>::rand32
                           (&in_stack_ffffffffffffff58->super_RandomMixin<FastRandomContext>);
    }
    else {
      local_9c = std::numeric_limits<unsigned_int>::max();
    }
    pvVar7->nSequence = local_9c;
  }
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<>
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_00);
    pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::back
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff58);
    CVar9 = RandMoney<FastRandomContext_&>(in_stack_ffffffffffffff58);
    pvVar8->nValue = CVar9;
    RandomScript((SigHashTest *)in_RDI,(CScript *)CONCAT44(uVar3,in_stack_ffffffffffffff70));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandomTransaction(CMutableTransaction& tx, bool fSingle)
{
    tx.version = m_rng.rand32();
    tx.vin.clear();
    tx.vout.clear();
    tx.nLockTime = (m_rng.randbool()) ? m_rng.rand32() : 0;
    int ins = (m_rng.randbits(2)) + 1;
    int outs = fSingle ? ins : (m_rng.randbits(2)) + 1;
    for (int in = 0; in < ins; in++) {
        tx.vin.emplace_back();
        CTxIn &txin = tx.vin.back();
        txin.prevout.hash = Txid::FromUint256(m_rng.rand256());
        txin.prevout.n = m_rng.randbits(2);
        RandomScript(txin.scriptSig);
        txin.nSequence = (m_rng.randbool()) ? m_rng.rand32() : std::numeric_limits<uint32_t>::max();
    }
    for (int out = 0; out < outs; out++) {
        tx.vout.emplace_back();
        CTxOut &txout = tx.vout.back();
        txout.nValue = RandMoney(m_rng);
        RandomScript(txout.scriptPubKey);
    }
}